

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O3

void Bitmap_Operation::Save
               (string *path,Image *image,uint32_t startX,uint32_t startY,uint32_t width,
               uint32_t height)

{
  byte bVar1;
  uint uVar2;
  value_type_conflict2 *__val;
  void *__s;
  imageException *piVar3;
  undefined4 in_register_0000000c;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  undefined1 uVar9;
  uint uVar10;
  long lVar11;
  uchar *puVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> temp;
  fstream file;
  allocator_type local_292;
  value_type_conflict2 local_291;
  void *local_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  Image *local_270;
  ulong local_268;
  undefined8 local_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  long local_240 [2];
  char local_230 [16];
  byte abStack_220 [496];
  
  local_260 = CONCAT44(in_register_0000000c,startY);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,startX,startY,width,height);
  bVar1 = image->_colorCount;
  local_270 = image;
  if (bVar1 == 1) {
    lVar8 = 0x400;
    __s = operator_new(0x400);
    lVar11 = 0;
    memset(__s,0,0x400);
    do {
      uVar9 = (undefined1)lVar11;
      *(undefined1 *)((long)__s + lVar11 * 4) = uVar9;
      *(undefined1 *)((long)__s + lVar11 * 4 + 1) = uVar9;
      *(undefined1 *)((long)__s + lVar11 * 4 + 2) = uVar9;
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + -4;
    } while (lVar8 != 0);
    pvVar5 = (void *)((long)__s + 0x400);
    iVar7 = 0x436;
    bVar1 = local_270->_colorCount;
    local_290 = __s;
  }
  else {
    iVar7 = 0x36;
    pvVar5 = (void *)0x0;
    local_290 = (void *)0x0;
  }
  std::fstream::fstream(local_240);
  std::fstream::open((string *)local_240,(_Ios_Openmode)path);
  if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) == 0) {
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x14);
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = 'B';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = 'M';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x14;
    uVar10 = bVar1 * width + 3 & 0xfffffffc;
    iVar4 = uVar10 * height;
    *(int *)(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 2) = iVar4 + iVar7;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    *(int *)(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 10) = iVar7;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_268 = (ulong)bVar1;
    std::ostream::write(local_230,
                        (long)local_288.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_288,0x38);
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '(';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    *(uint32_t *)
     (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + 4) = width;
    *(uint32_t *)
     (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + 8) = height;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\x01';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    *(short *)(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + 0xe) = (short)local_268 * 8;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    *(int *)(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x14) = iVar4;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x18] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x19] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1a] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1b] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1d] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1e] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1f] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x20] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x21] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x22] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x23] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x24] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x25] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x26] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x27] = '\0';
    std::ostream::write(local_230,
                        (long)local_288.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (local_290 != pvVar5) {
      std::ostream::write(local_230,(long)local_290);
    }
    std::ostream::flush();
    uVar2 = local_270->_rowSize;
    puVar12 = local_270->_data;
    local_291 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_258,(ulong)uVar10,&local_291,&local_292);
    if (height != 0) {
      puVar12 = puVar12 + (ulong)(startX * (int)local_268) +
                          (ulong)(((int)local_260 + -1 + height) * uVar2);
      uVar6 = local_268 & 0xffffffff;
      do {
        memcpy(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,puVar12,uVar6 * width);
        std::ostream::write(local_230,
                            (long)local_258.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        std::ostream::flush();
        puVar12 = puVar12 + -(ulong)uVar2;
        height = height - 1;
      } while (height != 0);
    }
    pvVar5 = local_290;
    if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) == 0) {
      if (local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::fstream::~fstream(local_240);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5);
      }
      return;
    }
    piVar3 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(piVar3,"failed to write data into file");
    __cxa_throw(piVar3,&imageException::typeinfo,imageException::~imageException);
  }
  piVar3 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(piVar3,"Cannot create file for saving");
  __cxa_throw(piVar3,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Save( const std::string & path, const PenguinV_Image::Image & image, uint32_t startX, uint32_t startY,
               uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, startX, startY, width, height );

        uint32_t palleteSize = 0;
        std::vector < uint8_t > pallete;

        // Create a pallete only for gray-scale image
        if( image.colorCount() == 1u ) {
            pallete = generateGrayScalePallete();
            palleteSize = static_cast<uint32_t>( pallete.size() );
        }

        const uint8_t colorCount = image.colorCount();

        uint32_t lineLength = width * colorCount;
        if( lineLength % BITMAP_ALIGNMENT != 0 )
            lineLength = (lineLength / BITMAP_ALIGNMENT + 1) * BITMAP_ALIGNMENT;

        BitmapFileHeader header;
        BitmapInfoHeader info;

        header.bfSize    = header.overallSize + info.size() + palleteSize + lineLength * height;
        header.bfOffBits = header.overallSize + info.size() + palleteSize;

        info.setWidth     ( width );
        info.setHeight    ( height );
        info.setColorCount( colorCount );
        info.setImageSize ( lineLength * height );

        std::fstream file;
        file.open( path, std::fstream::out | std::fstream::trunc | std::fstream::binary );

        if( !file )
            throw imageException( "Cannot create file for saving" );

        std::vector < uint8_t > data( sizeof( BitmapFileHeader ) );

        header.get( data );
        file.write( reinterpret_cast<const char *>(data.data()), header.overallSize );

        data.resize( sizeof( BitmapInfoHeader ) );

        info.get( data );
        file.write( reinterpret_cast<const char *>(data.data()), info.size() );

        if( !pallete.empty() )
            file.write( reinterpret_cast<const char *>(pallete.data()), static_cast<std::streamsize>(pallete.size()) );

        file.flush();

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY = image.data() + (startY + height - 1) * rowSize + startX * colorCount;

        std::vector < uint8_t > temp( lineLength, 0 );

        for( uint32_t rowId = 0; rowId < height; ++rowId, imageY -= rowSize ) {
            memcpy( temp.data(), imageY, sizeof( uint8_t ) * width * colorCount );

            file.write( reinterpret_cast<const char *>(temp.data()), lineLength );
            file.flush();
        }

        if( !file )
            throw imageException( "failed to write data into file" );
    }